

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O2

int __thiscall
QHttpNetworkConnectionPrivate::init(QHttpNetworkConnectionPrivate *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  int i;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QObject local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&this->field_0x8;
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < this->channelCount; lVar2 = lVar2 + 1) {
    QHttpNetworkConnectionChannel::setConnection
              ((QHttpNetworkConnectionChannel *)(&this->channels->super_QObject + lVar3),
               *(QHttpNetworkConnection **)&this->field_0x8);
    (&this->channels->ssl)[lVar3] = this->encrypt;
    lVar3 = lVar3 + 0x108;
  }
  QTimer::setSingleShot(SUB81(&this->delayedConnectionTimer,0));
  QObject::connect(local_30,(char *)&this->delayedConnectionTimer,(QObject *)"2timeout()",pcVar1,
                   0x24d380);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::init()
{
    Q_Q(QHttpNetworkConnection);
    for (int i = 0; i < channelCount; i++) {
        channels[i].setConnection(this->q_func());
        channels[i].ssl = encrypt;
    }

    delayedConnectionTimer.setSingleShot(true);
    QObject::connect(&delayedConnectionTimer, SIGNAL(timeout()), q, SLOT(_q_connectDelayedChannel()));
}